

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O3

void MapOptHandler_edata(FMapInfoParser *parse,level_info_t *info)

{
  FEDOptions *pFVar1;
  FName local_14;
  
  FName::NameManager::FindName(&FName::NameData,"EData",false);
  pFVar1 = level_info_t::GetOptData<FEDOptions>(info,&local_14,true);
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetString(&parse->sc);
  FString::operator=(&pFVar1->EDName,(parse->sc).String);
  return;
}

Assistant:

DEFINE_MAP_OPTION(edata, false)
{
	FEDOptions *opt = info->GetOptData<FEDOptions>("EData");

	parse.ParseAssign();
	parse.sc.MustGetString();
	opt->EDName = parse.sc.String;
}